

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall TiXmlDeclaration::CopyTo(TiXmlDeclaration *this,TiXmlDeclaration *target)

{
  Rep *pRVar1;
  size_t len;
  char *__s;
  
  __s = ((this->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(target->super_TiXmlNode).value,__s,len);
  (target->super_TiXmlNode).super_TiXmlBase.userData =
       (this->super_TiXmlNode).super_TiXmlBase.userData;
  (target->super_TiXmlNode).super_TiXmlBase.location =
       (this->super_TiXmlNode).super_TiXmlBase.location;
  pRVar1 = (this->version).rep_;
  TiXmlString::assign(&target->version,pRVar1->str,pRVar1->size);
  pRVar1 = (this->encoding).rep_;
  TiXmlString::assign(&target->encoding,pRVar1->str,pRVar1->size);
  pRVar1 = (this->standalone).rep_;
  TiXmlString::assign(&target->standalone,pRVar1->str,pRVar1->size);
  return;
}

Assistant:

void TiXmlDeclaration::CopyTo( TiXmlDeclaration* target ) const
{
	TiXmlNode::CopyTo( target );

	target->version = version;
	target->encoding = encoding;
	target->standalone = standalone;
}